

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O1

EventLogEntry * __thiscall
TTD::EventLog::RecordJsRTCodeParse
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper,LoadScriptFlag loadFlag,
          bool isUft8,byte *script,uint32 scriptByteLength,uint64 sourceContextId,char16 *sourceUri)

{
  uchar *dst;
  JsRTCodeParseAction *local_50;
  JsRTCodeParseAction *cpAction;
  EventLogEntry *local_40;
  LoadScriptFlag local_34;
  
  local_50 = (JsRTCodeParseAction *)0x0;
  cpAction = (JsRTCodeParseAction *)script;
  local_34 = loadFlag;
  local_40 = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTCodeParseAction,(TTD::NSLogEvents::EventKind)67>
                       (this,&local_50);
  local_50->BodyCtrId = 0;
  local_50->IsUtf8 = isUft8;
  local_50->SourceByteLength = scriptByteLength;
  dst = SlabAllocatorBase<8>::SlabAllocateArray<unsigned_char>
                  (&this->m_eventSlabAllocator,(ulong)scriptByteLength);
  local_50->SourceCode = dst;
  js_memcpy_s(dst,(ulong)local_50->SourceByteLength,cpAction,(ulong)scriptByteLength);
  SlabAllocatorBase<8>::CopyNullTermStringInto
            (&this->m_eventSlabAllocator,sourceUri,&local_50->SourceUri);
  local_50->SourceContextId = sourceContextId;
  local_50->LoadFlag = local_34;
  if (actionPopper->m_actionEvent == (EventLogEntry *)0x0) {
    actionPopper->m_actionEvent = local_40;
    actionPopper->m_resultPtr = &local_50->Result;
    local_50->Result = (TTDVar)0x0;
    return local_40;
  }
  TTDAbort_unrecoverable_error("Don\'t double initialize");
}

Assistant:

NSLogEvents::EventLogEntry* EventLog::RecordJsRTCodeParse(TTDJsRTActionResultAutoRecorder& actionPopper, LoadScriptFlag loadFlag, bool isUft8, const byte* script, uint32 scriptByteLength, uint64 sourceContextId, const char16* sourceUri)
    {
        NSLogEvents::JsRTCodeParseAction* cpAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTCodeParseAction, NSLogEvents::EventKind::CodeParseActionTag>(&cpAction);

        cpAction->BodyCtrId = 0; //initialize to known default -- should always update later or something is wrong

        cpAction->IsUtf8 = isUft8;
        cpAction->SourceByteLength = scriptByteLength;

        cpAction->SourceCode = this->m_eventSlabAllocator.SlabAllocateArray<byte>(cpAction->SourceByteLength);
        js_memcpy_s(cpAction->SourceCode, cpAction->SourceByteLength, script, scriptByteLength);

        this->m_eventSlabAllocator.CopyNullTermStringInto(sourceUri, cpAction->SourceUri);
        cpAction->SourceContextId = sourceContextId;

        cpAction->LoadFlag = loadFlag;

        actionPopper.InitializeWithEventAndEnterWResult(evt, &(cpAction->Result));

        return evt;
    }